

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

Value * __thiscall Json::Value::demand(Value *this,char *begin,char *end)

{
  Value *pVVar1;
  OStringStream oss;
  String local_1a0;
  ostringstream local_180 [376];
  
  if ((*(char *)&this->bits_ != '\0') && (*(char *)&this->bits_ != '\a')) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::operator<<((ostream *)local_180,
                    "in Json::Value::demand(begin, end): requires objectValue or nullValue");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  }
  pVVar1 = resolveReference(this,begin,end);
  return pVVar1;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}